

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libelftc_dem_gnu3.c
# Opt level: O0

_Bool vector_str_grow(vector_str *v)

{
  size_t sVar1;
  ulong uVar2;
  char **ppcVar3;
  double dVar4;
  undefined1 auVar5 [16];
  char **tmp_ctn;
  size_t tmp_cap;
  size_t i;
  vector_str *v_local;
  
  if (v == (vector_str *)0x0) {
    v_local._7_1_ = false;
  }
  else {
    if (v->capacity == 0) {
      __assert_fail("v->capacity > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/libcxxrt[P]libcxxrt/src/libelftc_dem_gnu3.c"
                    ,0xeb,"_Bool vector_str_grow(struct vector_str *)");
    }
    sVar1 = v->capacity;
    auVar5._8_4_ = (int)(sVar1 >> 0x20);
    auVar5._0_8_ = sVar1;
    auVar5._12_4_ = 0x45300000;
    dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) + 0.5) * 1.618;
    uVar2 = (ulong)dVar4;
    uVar2 = uVar2 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
    if (uVar2 <= v->capacity) {
      __assert_fail("tmp_cap > v->capacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/libcxxrt[P]libcxxrt/src/libelftc_dem_gnu3.c"
                    ,0xef,"_Bool vector_str_grow(struct vector_str *)");
    }
    ppcVar3 = (char **)malloc(uVar2 << 3);
    if (ppcVar3 == (char **)0x0) {
      v_local._7_1_ = false;
    }
    else {
      for (tmp_cap = 0; tmp_cap < v->size; tmp_cap = tmp_cap + 1) {
        ppcVar3[tmp_cap] = v->container[tmp_cap];
      }
      free(v->container);
      v->container = ppcVar3;
      v->capacity = uVar2;
      v_local._7_1_ = true;
    }
  }
  return v_local._7_1_;
}

Assistant:

static bool
vector_str_grow(struct vector_str *v)
{
	size_t i, tmp_cap;
	char **tmp_ctn;

	if (v == NULL)
		return (false);

	assert(v->capacity > 0);

	tmp_cap = BUFFER_GROW(v->capacity);

	assert(tmp_cap > v->capacity);

	if ((tmp_ctn = malloc(sizeof(char *) * tmp_cap)) == NULL)
		return (false);

	for (i = 0; i < v->size; ++i)
		tmp_ctn[i] = v->container[i];

	free(v->container);

	v->container = tmp_ctn;
	v->capacity = tmp_cap;

	return (true);
}